

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O3

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  int iVar1;
  int _h;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  unsigned_short uVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  uint uVar10;
  void *pvVar11;
  size_t sVar12;
  int q;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  
  if (this->type_from == this->type_to) {
    iVar7 = 0;
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar7 = bottom_blob->w;
      iVar8 = bottom_blob->h;
      iVar1 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar7;
      top_blob->h = iVar8;
      top_blob->c = iVar1;
      top_blob->cstep = bottom_blob->cstep;
      iVar7 = 0;
    }
  }
  else {
    _c = bottom_blob->c;
    uVar15 = (ulong)_c;
    iVar7 = bottom_blob->dims;
    iVar8 = bottom_blob->elempack;
    sVar12 = (size_t)iVar8;
    switch(this->type_to) {
    case 1:
      sVar12 = sVar12 * 4;
      break;
    case 2:
    case 4:
      sVar12 = (size_t)(iVar8 * 2);
      break;
    case 3:
      break;
    default:
      sVar12 = bottom_blob->elemsize;
    }
    iVar1 = bottom_blob->w;
    _h = bottom_blob->h;
    if (iVar7 == 3) {
      Mat::create(top_blob,iVar1,_h,_c,sVar12,iVar8,opt->blob_allocator);
    }
    else if (iVar7 == 2) {
      Mat::create(top_blob,iVar1,_h,sVar12,iVar8,opt->blob_allocator);
    }
    else if (iVar7 == 1) {
      Mat::create(top_blob,iVar1,sVar12,iVar8,opt->blob_allocator);
    }
    iVar7 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar10 = _h * iVar1 * iVar8;
      iVar7 = this->type_from;
      iVar8 = this->type_to;
      if (0 < (int)_c && (iVar8 == 2 && iVar7 == 1)) {
        uVar13 = 0;
        do {
          if (0 < (int)uVar10) {
            sVar12 = bottom_blob->elemsize;
            sVar3 = top_blob->elemsize;
            sVar4 = top_blob->cstep;
            pvVar9 = top_blob->data;
            sVar5 = bottom_blob->cstep;
            pvVar11 = bottom_blob->data;
            uVar14 = 0;
            do {
              uVar6 = float32_to_float16(*(float *)((long)pvVar11 +
                                                   uVar14 * 4 + sVar12 * sVar5 * uVar13));
              *(unsigned_short *)((long)pvVar9 + uVar14 * 2 + sVar3 * sVar4 * uVar13) = uVar6;
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar15);
        iVar7 = this->type_from;
        iVar8 = this->type_to;
      }
      if ((iVar8 == 1 && iVar7 == 2) && 0 < (int)_c) {
        uVar13 = 0;
        do {
          if (0 < (int)uVar10) {
            sVar12 = bottom_blob->elemsize;
            sVar3 = top_blob->elemsize;
            sVar4 = top_blob->cstep;
            pvVar9 = top_blob->data;
            sVar5 = bottom_blob->cstep;
            pvVar11 = bottom_blob->data;
            uVar14 = 0;
            do {
              fVar16 = float16_to_float32(*(unsigned_short *)
                                           ((long)pvVar11 + uVar14 * 2 + sVar12 * sVar5 * uVar13));
              *(float *)((long)pvVar9 + uVar14 * 4 + sVar3 * sVar4 * uVar13) = fVar16;
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar15);
        iVar7 = this->type_from;
        iVar8 = this->type_to;
      }
      if ((iVar8 == 1 && iVar7 == 3) && 0 < (int)_c) {
        pvVar9 = bottom_blob->data;
        sVar12 = bottom_blob->cstep;
        pvVar11 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        sVar5 = bottom_blob->elemsize;
        uVar13 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar14 = 0;
            do {
              *(float *)((long)pvVar11 + uVar14 * 4) = (float)(int)*(char *)((long)pvVar9 + uVar14);
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
          uVar13 = uVar13 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
          pvVar9 = (void *)((long)pvVar9 + sVar12 * sVar5);
        } while (uVar13 != uVar15);
        iVar8 = this->type_to;
      }
      if ((iVar8 == 4 && iVar7 == 1) && 0 < (int)_c) {
        pvVar9 = bottom_blob->data;
        sVar12 = bottom_blob->cstep;
        pvVar11 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        sVar5 = bottom_blob->elemsize;
        uVar13 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar14 = 0;
            do {
              *(undefined2 *)((long)pvVar11 + uVar14 * 2) =
                   *(undefined2 *)((long)pvVar9 + uVar14 * 4 + 2);
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
          uVar13 = uVar13 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
          pvVar9 = (void *)((long)pvVar9 + sVar12 * sVar5);
        } while (uVar13 != uVar15);
        iVar8 = this->type_to;
      }
      if ((iVar8 == 1 && iVar7 == 4) && 0 < (int)_c) {
        pvVar9 = bottom_blob->data;
        sVar12 = bottom_blob->cstep;
        pvVar11 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        sVar5 = bottom_blob->elemsize;
        uVar13 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar14 = 0;
            do {
              *(uint *)((long)pvVar11 + uVar14 * 4) =
                   (uint)*(ushort *)((long)pvVar9 + uVar14 * 2) << 0x10;
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
          uVar13 = uVar13 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
          pvVar9 = (void *)((long)pvVar9 + sVar12 * sVar5);
        } while (uVar13 != uVar15);
      }
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * elempack;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_bfloat16(ptr[i]);
            }
        }
    }

    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = bfloat16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}